

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ManyToOneRingBuffer.h
# Opt level: O1

ssize_t __thiscall
aeron::concurrent::ringbuffer::ManyToOneRingBuffer::write
          (ManyToOneRingBuffer *this,int __fd,void *__buf,size_t __n)

{
  AtomicBuffer *pAVar1;
  int iVar2;
  long lVar3;
  AtomicBuffer *pAVar4;
  index_t index;
  undefined4 extraout_var;
  SourcedException *this_00;
  char *pcVar6;
  index_t in_R8D;
  size_t length;
  allocator local_c9;
  int local_c8;
  int local_c4;
  long local_c0;
  AtomicBuffer *local_b8;
  string local_b0;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  uint8_t *puVar5;
  
  if (0 < __fd) {
    checkMsgLength(this,in_R8D);
    index = claimCapacity(this,in_R8D + 0xfU & 0xfffffff8);
    puVar5 = (uint8_t *)CONCAT44(extraout_var,index);
    if (index != -2) {
      local_c4 = in_R8D + 8;
      pAVar1 = this->m_buffer;
      local_c8 = (int)__n;
      local_b8 = (AtomicBuffer *)__buf;
      AtomicBuffer::boundsCheck(pAVar1,index,8);
      local_c0 = (long)index;
      *(ulong *)(pAVar1->m_buffer + local_c0) = CONCAT44(__fd,-8 - in_R8D);
      pAVar1 = this->m_buffer;
      length = (size_t)in_R8D;
      AtomicBuffer::boundsCheck(pAVar1,index + 8,length);
      pAVar4 = local_b8;
      iVar2 = local_c8;
      AtomicBuffer::boundsCheck(local_b8,local_c8,length);
      lVar3 = local_c0;
      memcpy(pAVar1->m_buffer + local_c0 + 8,pAVar4->m_buffer + iVar2,length);
      pAVar1 = this->m_buffer;
      AtomicBuffer::boundsCheck(pAVar1,index,4);
      puVar5 = pAVar1->m_buffer;
      *(int *)(puVar5 + lVar3) = local_c4;
    }
    return CONCAT71((int7)((ulong)puVar5 >> 8),index != -2);
  }
  this_00 = (SourcedException *)__cxa_allocate_exception(0x48);
  std::__cxx11::to_string(&local_70,__fd);
  std::operator+(&local_50,"Message type id must be greater than zero, msgTypeId=",&local_70);
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b0,
             "void aeron::concurrent::ringbuffer::RecordDescriptor::checkMsgTypeId(std::int32_t)",""
            );
  pcVar6 = util::past_prefix("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                             ,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/build_O1/deps/aeron/src/aeron_project/aeron-client/src/main/cpp/concurrent/ringbuffer/RecordDescriptor.h"
                            );
  std::__cxx11::string::string((string *)&local_90,pcVar6,&local_c9);
  util::SourcedException::SourcedException(this_00,&local_50,&local_b0,&local_90,0x56);
  *(undefined ***)this_00 = &PTR__SourcedException_00162440;
  __cxa_throw(this_00,&util::IllegalArgumentException::typeinfo,
              util::SourcedException::~SourcedException);
}

Assistant:

bool write(
        std::int32_t msgTypeId, concurrent::AtomicBuffer& srcBuffer, util::index_t srcIndex, util::index_t length)
    {
        bool isSuccessful = false;

        RecordDescriptor::checkMsgTypeId(msgTypeId);
        checkMsgLength(length);

        const util::index_t recordLength = length + RecordDescriptor::HEADER_LENGTH;
        const util::index_t requiredCapacity = util::BitUtil::align(recordLength, RecordDescriptor::ALIGNMENT);
        const util::index_t recordIndex = claimCapacity(requiredCapacity);

        if (INSUFFICIENT_CAPACITY != recordIndex)
        {
            m_buffer.putInt64Ordered(recordIndex, RecordDescriptor::makeHeader(-recordLength, msgTypeId));
            m_buffer.putBytes(RecordDescriptor::encodedMsgOffset(recordIndex), srcBuffer, srcIndex, length);
            m_buffer.putInt32Ordered(RecordDescriptor::lengthOffset(recordIndex), recordLength);

            isSuccessful = true;
        }

        return isSuccessful;
    }